

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resbund.cpp
# Opt level: O2

void __thiscall icu_63::ResourceBundle::~ResourceBundle(ResourceBundle *this)

{
  void *in_RSI;
  
  ~ResourceBundle(this);
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return;
}

Assistant:

ResourceBundle::~ResourceBundle()
{
    if(fResource != 0) {
        ures_close(fResource);
    }
    if(fLocale != NULL) {
      delete(fLocale);
    }
}